

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsWebServer.cpp
# Opt level: O0

void __thiscall HttpSession::on_read(HttpSession *this,error_code eCode,size_t bytes_transferred)

{
  error_code eCode_00;
  bool bVar1;
  error_category *in_RDX;
  undefined8 in_RSI;
  error_code *in_RDI;
  send_lambda *in_stack_000007c8;
  request<boost::beast::http::basic_string_body<char>,_http::basic_fields<allocator<char>_>_>
  *in_stack_000007d0;
  error_code *in_stack_ffffffffffffff98;
  type *in_stack_ffffffffffffffb0;
  error in_stack_ffffffffffffffbc;
  HttpSession *in_stack_ffffffffffffffc0;
  error_code *what;
  
  what = in_RDI;
  boost::system::error_code::error_code<boost::beast::http::error>
            ((error_code *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
             in_stack_ffffffffffffffb0);
  bVar1 = boost::system::operator==(in_RDI,in_stack_ffffffffffffff98);
  if (bVar1) {
    do_close(in_stack_ffffffffffffffc0);
  }
  else {
    bVar1 = boost::system::error_code::operator_cast_to_bool((error_code *)&stack0xffffffffffffffe8)
    ;
    if (bVar1) {
      boost::system::error_code::error_code<boost::beast::error>
                ((error_code *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
                 in_stack_ffffffffffffffb0);
      bVar1 = boost::system::operator!=(in_RDI,in_stack_ffffffffffffff98);
      if (bVar1) {
        eCode_00.cat_ = in_RDX;
        eCode_00.val_ = (int)in_RSI;
        eCode_00.failed_ = SUB81(in_RSI,4);
        eCode_00._5_3_ = SUB83(in_RSI,5);
        fail(eCode_00,(char *)what);
      }
    }
    else {
      handle_request<boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,std::allocator<char>,HttpSession::send_lambda&>
                (in_stack_000007d0,in_stack_000007c8);
    }
  }
  return;
}

Assistant:

void on_read(beast::error_code eCode, std::size_t bytes_transferred)
    {
        boost::ignore_unused(bytes_transferred);

        // This means they closed the connection
        if (eCode == http::error::end_of_stream) {
            return do_close();
        }

        if (eCode) {
            if (beast::error::timeout != eCode) {
                fail(eCode, "helics web server read");
            }
            return;
        }

        // Send the response
        handle_request(std::move(req), lambda);
    }